

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_functions.hpp
# Opt level: O2

void test_quadrature<RadialGaussian,IntegratorXX::RadialTransformQuadrature<IntegratorXX::UniformTrapezoid<double,double>,IntegratorXX::MurrayHandyLamingRadialTraits<2ul>>>
               (string *msg,
               RadialTransformQuadrature<IntegratorXX::UniformTrapezoid<double,_double>,_IntegratorXX::MurrayHandyLamingRadialTraits<2UL>_>
               *quad,double ref,double e)

{
  long lVar1;
  double dVar2;
  int i;
  ulong uVar3;
  double dVar4;
  StringRef macroName;
  StringRef capturedExpression;
  double res;
  double local_110;
  double local_108;
  double local_100;
  string local_f8;
  ITransientExpression local_d8;
  double *local_c8;
  WithinAbsMatcher *local_c0;
  AssertionHandler catchAssertionHandler;
  WithinAbsMatcher local_70;
  
  res = 0.0;
  local_110 = ref;
  local_108 = e;
  for (uVar3 = 0; dVar2 = res,
      lVar1 = (long)(quad->
                    super_Quadrature<IntegratorXX::RadialTransformQuadrature<IntegratorXX::UniformTrapezoid<double,_double>,_IntegratorXX::MurrayHandyLamingRadialTraits<2UL>_>_>
                    ).
                    super_QuadratureBase<std::vector<double,_std::allocator<double>_>,_std::vector<double,_std::allocator<double>_>_>
                    .points_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
      uVar3 < (ulong)((long)(quad->
                            super_Quadrature<IntegratorXX::RadialTransformQuadrature<IntegratorXX::UniformTrapezoid<double,_double>,_IntegratorXX::MurrayHandyLamingRadialTraits<2UL>_>_>
                            ).
                            super_QuadratureBase<std::vector<double,_std::allocator<double>_>,_std::vector<double,_std::allocator<double>_>_>
                            .points_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_finish - lVar1 >> 3); uVar3 = uVar3 + 1) {
    local_100 = (quad->
                super_Quadrature<IntegratorXX::RadialTransformQuadrature<IntegratorXX::UniformTrapezoid<double,_double>,_IntegratorXX::MurrayHandyLamingRadialTraits<2UL>_>_>
                ).
                super_QuadratureBase<std::vector<double,_std::allocator<double>_>,_std::vector<double,_std::allocator<double>_>_>
                .weights_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start[uVar3];
    dVar4 = RadialGaussian::evaluate(*(double *)(lVar1 + uVar3 * 8));
    res = dVar2 + dVar4 * local_100;
  }
  local_70.super_MatcherBase<double>.super_MatcherUntypedBase._vptr_MatcherUntypedBase =
       (_func_int **)0x15b2f9;
  local_70.super_MatcherBase<double>.super_MatcherUntypedBase.m_cachedToString._M_dataplus._M_p =
       (pointer)0x79;
  macroName.m_size = 0xc;
  macroName.m_start = "REQUIRE_THAT";
  capturedExpression.m_size = 0x33;
  capturedExpression.m_start = "res, IntegratorXX::Matchers::WithinAbs(msg, ref, e)";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,macroName,(SourceLineInfo *)&local_70,capturedExpression,Normal)
  ;
  std::__cxx11::string::string((string *)&local_f8,(string *)msg);
  IntegratorXX::Matchers::WithinAbs(&local_70,&local_f8,local_110,local_108);
  local_d8.m_result = IntegratorXX::Matchers::WithinAbsMatcher::match(&local_70,&res);
  local_d8.m_isBinaryExpression = true;
  local_d8._vptr_ITransientExpression = (_func_int **)&PTR_streamReconstructedExpression_0129e200;
  local_c8 = &res;
  local_c0 = &local_70;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler,&local_d8);
  Catch::ITransientExpression::~ITransientExpression(&local_d8);
  IntegratorXX::Matchers::WithinAbsMatcher::~WithinAbsMatcher(&local_70);
  std::__cxx11::string::~string((string *)&local_f8);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  return;
}

Assistant:

void test_quadrature(std::string msg, const QuadType& quad, double ref, double e, PreArgs&&... args) {
  const auto& pts = quad.points();
  const auto& wgt = quad.weights();

  double res = 0.0;
  for(auto i = 0; i < quad.npts(); ++i) {
    res += wgt[i] * TestFunction::evaluate(args..., pts[i]);
  }
  
  //standard_matcher(mes, res, ref, e);
  //printf("diff = %.6e\n", std::abs(ref - res));
  REQUIRE_THAT(res, IntegratorXX::Matchers::WithinAbs(msg, ref, e));
}